

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O3

void WebPReplaceTransparentPixels(WebPPicture *pic,uint32_t color)

{
  int iVar1;
  uint uVar2;
  uint32_t *puVar3;
  
  if ((pic != (WebPPicture *)0x0) && (pic->use_argb != 0)) {
    iVar1 = pic->height;
    puVar3 = pic->argb;
    WebPInitAlphaProcessing();
    if (0 < iVar1) {
      uVar2 = iVar1 + 1;
      do {
        (*WebPAlphaReplace)(puVar3,pic->width,color & 0xffffff);
        puVar3 = puVar3 + pic->argb_stride;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
  }
  return;
}

Assistant:

void WebPReplaceTransparentPixels(WebPPicture* const pic, uint32_t color) {
  if (pic != NULL && pic->use_argb) {
    int y = pic->height;
    uint32_t* argb = pic->argb;
    color &= 0xffffffu;   // force alpha=0
    WebPInitAlphaProcessing();
    while (y-- > 0) {
      WebPAlphaReplace(argb, pic->width, color);
      argb += pic->argb_stride;
    }
  }
}